

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

String * __thiscall Process::readAllStdErr(String *__return_storage_ptr__,Process *this)

{
  Process *this_local;
  String *out;
  
  String::String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
  std::swap<String>(&this->mStdErrBuffer,__return_storage_ptr__);
  this->mStdErrIndex = 0;
  return __return_storage_ptr__;
}

Assistant:

String Process::readAllStdErr()
{
    String out;
    std::swap(mStdErrBuffer, out);
    mStdErrIndex = 0;
    return out;
}